

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::TrackerContext::endRun(TrackerContext *this)

{
  long in_RDI;
  __shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  
  clara::std::__shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

void TrackerContext::endRun() {
        m_rootTracker.reset();
        m_currentTracker = nullptr;
        m_runState = NotStarted;
    }